

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::PartialOccluderCullCase::genOccluderGeometry
          (ObjectData *__return_storage_ptr__,PartialOccluderCullCase *this)

{
  allocator_type local_161;
  _Vector_base<float,_std::allocator<float>_> local_160;
  float local_148 [5];
  undefined8 local_134;
  undefined8 uStack_12c;
  undefined8 local_124;
  undefined8 uStack_11c;
  undefined8 local_114;
  undefined8 uStack_10c;
  undefined8 local_104;
  undefined4 local_fc;
  float local_f8;
  undefined8 local_f4;
  undefined4 local_ec;
  float local_e8 [2];
  ProgramSources local_e0;
  
  Utils::getBaseShader();
  local_148[0] = this->m_coverage + this->m_coverage + -1.0;
  local_148[1] = 1.0;
  local_148[2] = 0.2;
  local_148[3] = 0.0;
  local_134 = 0x3e4ccccdbf800000;
  uStack_12c = 0xbf8000003f800000;
  local_124 = 0x3e4ccccdbf800000;
  uStack_11c = 0xbf80000040000000;
  local_114 = 0x3e4ccccdbf800000;
  uStack_10c = 0xbf80000000000000;
  local_104 = 0x3e4ccccd3f800000;
  local_fc = 0x3f800000;
  local_f4 = 0x3e4ccccd3f800000;
  local_ec = 0x40000000;
  local_148[4] = local_148[0];
  local_f8 = local_148[0];
  std::vector<float,std::allocator<float>>::vector<float_const*,void>
            ((vector<float,std::allocator<float>> *)&local_160,local_148,local_e8,&local_161);
  ObjectData::ObjectData(__return_storage_ptr__,&local_e0,(Geometry *)&local_160);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_160);
  glu::ProgramSources::~ProgramSources(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccluderGeometry			(void) const { return ObjectData(Utils::getBaseShader(), Utils::getPartScreenQuad(m_coverage, 0.2f)); }